

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cc
# Opt level: O3

string * load_string_abi_cxx11_
                   (string *__return_storage_ptr__,bool use_colors,bool use_powerline_left,
                   bool use_powerline_right,short num_averages,bool segments_to_right,
                   short right_color)

{
  double dVar1;
  long lVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  ostream *poVar6;
  byte bVar7;
  undefined7 in_register_00000009;
  POWERLINE_DIRECTION PVar8;
  undefined7 in_register_00000011;
  int __nelem;
  undefined7 in_register_00000031;
  undefined6 in_register_00000082;
  undefined3 in_register_00000089;
  ulong uVar9;
  double *pdVar10;
  char (*color) [32];
  double *__loadavg;
  float fVar11;
  undefined8 uStack_1e0;
  double local_1d8;
  ostringstream ss;
  uint auStack_1c0 [22];
  ios_base local_168 [264];
  undefined1 *local_60;
  undefined4 local_54;
  string *local_50;
  undefined4 local_44;
  POWERLINE_DIRECTION local_40;
  undefined4 local_3c;
  uint local_38;
  char local_31;
  
  pdVar10 = &local_1d8;
  local_3c = (undefined4)CONCAT71(in_register_00000009,use_powerline_right);
  local_40 = (POWERLINE_DIRECTION)CONCAT71(in_register_00000011,use_powerline_left);
  local_44 = (undefined4)CONCAT71(in_register_00000031,use_colors);
  uStack_1e0 = 0x104b69;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d8);
  *(uint *)((long)auStack_1c0 + *(long *)((long)local_1d8 + -0x18)) =
       *(uint *)((long)auStack_1c0 + *(long *)((long)local_1d8 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&ss + *(long *)((long)local_1d8 + -0x18)) = 2;
  lVar2 = -(ulong)((uint)(ushort)num_averages * 8 + 0xf & 0xfffffff0);
  __loadavg = (double *)((long)&local_1d8 + lVar2);
  if ((ushort)(num_averages - 4U) < 0xfffd) {
    local_31 = '\0';
    *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104bd2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d8,&local_31,1);
    pdVar10 = &local_1d8;
  }
  else {
    *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104be2;
    __nelem = (int)CONCAT62(in_register_00000082,num_averages);
    iVar3 = getloadavg(__loadavg,__nelem);
    if (iVar3 < 0) {
      *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104d80;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d8," 0.00 0.00 0.00",0xf);
    }
    else {
      local_54 = CONCAT31(in_register_00000089,segments_to_right);
      local_50 = (string *)*__loadavg;
      *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104bfd;
      uVar4 = get_cpu_count();
      uVar5 = (uint)(long)(((double)local_50 / (double)uVar4) * 0.5 * 100.0);
      local_38 = 100;
      if (uVar5 < 100) {
        local_38 = uVar5;
      }
      if ((char)local_44 != '\0') {
        uVar9 = (ulong)local_38;
        PVar8 = POWERLINE_RIGHT;
        if ((char)local_3c == '\0') {
          PVar8 = local_40 & 0xff;
        }
        *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104c68;
        powerline((ostringstream *)&local_1d8,load_lut[uVar9],PVar8,false);
      }
      local_31 = ' ';
      *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104c80;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d8,&local_31,1);
      local_60 = (undefined1 *)&local_1d8;
      local_50 = __return_storage_ptr__;
      uVar9 = 0;
      do {
        dVar1 = __loadavg[uVar9];
        *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104cbb;
        fVar11 = floorf((float)dVar1 * 100.0 + 0.5);
        if (__nelem - 1 == uVar9) {
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104cd4;
          std::ostream::_M_insert<double>((double)(fVar11 / 100.0));
        }
        else {
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104cde;
          poVar6 = std::ostream::_M_insert<double>((double)(fVar11 / 100.0));
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104cf2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        }
        __return_storage_ptr__ = local_50;
        pdVar10 = (double *)local_60;
        uVar9 = uVar9 + 1;
      } while ((CONCAT62(in_register_00000082,num_averages) & 0xffffffff) != uVar9);
      if ((char)local_44 != '\0') {
        bVar7 = (byte)local_54;
        if (((byte)local_40 & bVar7) == 1) {
          color = load_lut + local_38;
          PVar8 = POWERLINE_LEFT;
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104d4a;
          powerline((ostringstream *)&local_1d8,*color,POWERLINE_LEFT,true);
        }
        else {
          if ((byte)local_40 == 1 && bVar7 == 0) {
            uVar9 = (ulong)local_38;
            *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104e17;
            powerline((ostringstream *)&local_1d8,load_lut[uVar9],POWERLINE_LEFT,true);
            *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104e31;
            powerline((ostringstream *)&local_1d8,"#[fg=default,bg=default]",POWERLINE_LEFT,false);
            goto LAB_00104d80;
          }
          if ((char)local_3c == '\0') {
            *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104e4e;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1d8,"#[fg=default,bg=default]",0x18);
            goto LAB_00104d80;
          }
          if (bVar7 == 0) goto LAB_00104d80;
          color = load_lut + local_38;
          PVar8 = POWERLINE_RIGHT;
        }
        *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104d66;
        powerline_char((ostringstream *)&local_1d8,*color,right_color,PVar8,true);
      }
    }
  }
LAB_00104d80:
  *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104d8f;
  std::__cxx11::stringbuf::str();
  *(undefined8 *)((long)pdVar10 + -8) = 0x104da5;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d8);
  *(undefined8 *)((long)pdVar10 + -8) = 0x104db1;
  std::ios_base::~ios_base(local_168);
  return __return_storage_ptr__;
}

Assistant:

std::string load_string( bool use_colors,
  bool use_powerline_left, bool use_powerline_right, short num_averages,
  bool segments_to_right, short right_color )
{
  std::ostringstream ss;
  ss.setf( std::ios::fixed, std::ios::floatfield );
  ss.precision( 2 );
  double averages[num_averages];
  // based on: opensource.apple.com/source/Libc/Libc-262/gen/getloadavg.c

  if( num_averages <= 0 || num_averages > 3)
  {
    ss << (char) 0;
    return ss.str();
  }

  if( getloadavg( averages, num_averages ) < 0 )
  {
    ss << " 0.00 0.00 0.00"; // couldn't get averages.
  }
  else
  {
    unsigned load_percent = static_cast<unsigned int>( averages[0] /
        get_cpu_count() * 0.5f * 100.0f );

    if( load_percent > 100 )
    {
      load_percent = 100;
    }
    if( use_colors )
    {
      if( use_powerline_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_RIGHT );
      }
      else if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT );
      }
      else
      {
        powerline( ss, load_lut[load_percent], NONE );
      }
    }

    ss << ' ';
    for( int i = 0; i < num_averages; ++i )
    {
      // Round to nearest, make sure this is only a 0.00 value not a 0.0000
      float avg = floorf( static_cast<float>( averages[i] ) * 100 + 0.5 ) / 100;
      // Don't print trailing whitespace for last element
      if ( i == num_averages-1 )
      {
        ss << avg;
      }
      else
      {
        ss << avg << " ";
      }
    }

    if( use_colors )
    {
      if( use_powerline_left && segments_to_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline_char( ss, load_lut[load_percent], right_color, POWERLINE_LEFT, true );
      }
      else if( use_powerline_left && !segments_to_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline( ss, "#[fg=default,bg=default]", POWERLINE_LEFT );
      }
      else if( !use_powerline_right )
      {
        ss << "#[fg=default,bg=default]";
      }
      else if ( segments_to_right && use_powerline_right )
      {
        powerline_char( ss, load_lut[load_percent], right_color, POWERLINE_RIGHT, true );
      }
    }
  }

  return ss.str();
}